

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O2

long __thiscall glcts::anon_unknown_0::UniformLocTypesMat::Run(UniformLocTypesMat *this)

{
  UniformValueGenerator *generator;
  long lVar1;
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  uniforms;
  Uniform local_428;
  UniformType local_250;
  UniformType local_1c0;
  UniformType local_130;
  UniformType local_a0;
  
  uniforms.
  super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  uniforms.
  super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uniforms.
  super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  UniformType::UniformType(&local_a0,0x8b65,0);
  generator = &(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator;
  anon_unknown_0::Uniform::Uniform
            (&local_428,generator,&local_a0,(Loc)ZEXT812(1),(DefOccurence)0x0,(DefOccurence)0x0);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::push_back(&uniforms,&local_428);
  anon_unknown_0::Uniform::~Uniform(&local_428);
  UniformType::~UniformType(&local_a0);
  UniformType::UniformType(&local_130,0x8b67,0);
  anon_unknown_0::Uniform::Uniform
            (&local_428,generator,&local_130,(Loc)ZEXT812(2),(DefOccurence)0x0,(DefOccurence)0x0);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::push_back(&uniforms,&local_428);
  anon_unknown_0::Uniform::~Uniform(&local_428);
  UniformType::~UniformType(&local_130);
  UniformType::UniformType(&local_1c0,0x8b5a,0);
  anon_unknown_0::Uniform::Uniform
            (&local_428,generator,&local_1c0,(Loc)ZEXT812(0),(DefOccurence)0x0,(DefOccurence)0x0);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::push_back(&uniforms,&local_428);
  anon_unknown_0::Uniform::~Uniform(&local_428);
  UniformType::~UniformType(&local_1c0);
  UniformType::UniformType(&local_250,0x8b6a,0);
  anon_unknown_0::Uniform::Uniform
            (&local_428,generator,&local_250,(Loc)ZEXT812(3),(DefOccurence)0x0,(DefOccurence)0x0);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::push_back(&uniforms,&local_428);
  anon_unknown_0::Uniform::~Uniform(&local_428);
  UniformType::~UniformType(&local_250);
  lVar1 = ExplicitUniformLocationCaseBase::doRun
                    (&this->super_ExplicitUniformLocationCaseBase,&uniforms);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::~vector(&uniforms);
  return lVar1;
}

Assistant:

virtual long Run()
	{
		std::vector<Uniform> uniforms;
		//layout (location = 1) uniform mat2x3   u0;
		//layout (location = 2) uniform mat3x2   u1;
		//layout (location = 0) uniform mat2     u2;
		//layout (location = 3) uniform imat3x4  u3;
		uniforms.push_back(Uniform(uniformValueGenerator, GL_FLOAT_MAT2x3, Loc::C(1)));
		uniforms.push_back(Uniform(uniformValueGenerator, GL_FLOAT_MAT3x2, Loc::C(2)));
		uniforms.push_back(Uniform(uniformValueGenerator, GL_FLOAT_MAT2, Loc::C(0)));
		uniforms.push_back(Uniform(uniformValueGenerator, GL_FLOAT_MAT4x3, Loc::C(3)));
		return doRun(uniforms);
	}